

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

reference __thiscall
absl::InlinedVector<int,4ul,std::allocator<int>>::GrowAndEmplaceBack<int_const&>
          (InlinedVector<int,4ul,std::allocator<int>> *this,int *args)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  InlinedVector<int,4ul,std::allocator<int>> *pIVar4;
  ulong uVar5;
  long lVar6;
  Allocation new_allocation;
  
  uVar1 = *(ulong *)this;
  uVar5 = uVar1 >> 1;
  uVar2 = 4;
  if ((uVar1 & 1) != 0) {
    uVar2 = *(ulong *)(this + 8);
  }
  if (uVar5 == uVar2) {
    piVar3 = __gnu_cxx::new_allocator<int>::allocate
                       ((new_allocator<int> *)this,uVar1 & 0xfffffffffffffffe,(void *)0x0);
    piVar3[uVar5] = *args;
    if (((byte)*this & 1) == 0) {
      pIVar4 = this + 8;
    }
    else {
      pIVar4 = *(InlinedVector<int,4ul,std::allocator<int>> **)(this + 0x10);
    }
    if (1 < uVar1) {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)piVar3 + lVar6) = *(undefined4 *)(pIVar4 + lVar6);
        lVar6 = lVar6 + 4;
      } while (uVar5 * 4 - lVar6 != 0);
    }
    new_allocation.buffer_ = piVar3;
    new_allocation.capacity_ = uVar1 & 0xfffffffffffffffe;
    InlinedVector<int,_4UL,_std::allocator<int>_>::ResetAllocation
              ((InlinedVector<int,_4UL,_std::allocator<int>_> *)this,new_allocation,uVar5 + 1);
    return piVar3 + uVar5;
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<int, 4>::GrowAndEmplaceBack(Args &&...) [T = int, N = 4, A = std::allocator<int>, Args = <const int &>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }